

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uint64 value,uint8 *target)

{
  byte *pbVar1;
  uint8 *target_local;
  uint64 value_local;
  byte *local_18;
  ulong local_10;
  byte *local_8;
  
  if (value < 0x80) {
    *target = (byte)value;
    local_8 = target + 1;
  }
  else {
    *target = (byte)value | 0x80;
    local_10 = value >> 7;
    if (local_10 < 0x80) {
      target[1] = (uint8)local_10;
      local_8 = target + 2;
    }
    else {
      pbVar1 = target + 1;
      do {
        local_18 = pbVar1;
        *local_18 = (byte)local_10 | 0x80;
        local_10 = local_10 >> 7;
        pbVar1 = local_18 + 1;
      } while (0x7f < local_10);
      local_8 = local_18 + 2;
      local_18[1] = (byte)local_10;
    }
  }
  return local_8;
}

Assistant:

inline uint8* CodedOutputStream::WriteVarint64ToArray(uint64 value,
                                                      uint8* target) {
  return EpsCopyOutputStream::UnsafeVarint(value, target);
}